

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eumorphic.hpp
# Opt level: O2

void __thiscall
eumorphic::ordered_collection<container,_a,_b,_c>::insert<a>
          (ordered_collection<container,_a,_b,_c> *this,a *value)

{
  unsigned_long local_18;
  
  local_18 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->types_order,&local_18);
  std::vector<a,_std::allocator<a>_>::emplace_back<a>((vector<a,_std::allocator<a>_> *)this,value);
  return;
}

Assistant:

constexpr void insert(T&& value)
		{
                        using namespace detail;
						using Td = std::decay_t<T>;
                        constexpr auto  type_index = index_of(Base::segments_container_t, hana::type_c< Container<Td> >);

                        types_order.push_back( type_index );

                        hana::at(Base::data_, type_index).push_back(std::forward<T>(value));
		}